

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogger.cpp
# Opt level: O2

void __thiscall
SLogLib::FileLogger::_WriteMessages
          (FileLogger *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *messages)

{
  FileLoggerPriv *pFVar1;
  pointer pbVar2;
  char cVar3;
  ostream *poVar4;
  runtime_error *this_00;
  recursive_mutex *__mutex;
  string *_message;
  pointer pbVar5;
  string local_1d0 [32];
  stringstream _stream;
  ostream local_1a0 [376];
  
  __mutex = &this->mPriv->mFileWriteMutex;
  std::recursive_mutex::lock(__mutex);
  pFVar1 = this->mPriv;
  if (((&pFVar1->field_0x20)[*(long *)(*(long *)pFVar1 + -0x18)] & 5) != 0) {
    std::ofstream::open((char *)pFVar1,(_Ios_Openmode)(pFVar1->mFileName)._M_dataplus._M_p);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&_stream);
      poVar4 = std::operator<<(local_1a0,"SLogLib: Unable to open ");
      poVar4 = std::operator<<(poVar4,(string *)&this->mPriv->mFileName);
      std::operator<<(poVar4," for writing.");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1d0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pbVar2 = (messages->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (messages->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1) {
    std::operator<<((ostream *)this->mPriv,(string *)pbVar5);
  }
  if (this->mPriv->mHasAutoFlush != false) {
    FlushDevice(this);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void FileLogger::_WriteMessages(const std::vector<std::string>& messages)
{
	std::lock_guard<std::recursive_mutex> _lock(mPriv->mFileWriteMutex);
	
	if(!mPriv->mFileHandle)
	{
		mPriv->mFileHandle.open(mPriv->mFileName.c_str());
		if(!mPriv->mFileHandle.is_open())
		{
			std::stringstream _stream;
			_stream << "SLogLib: Unable to open " << mPriv->mFileName << " for writing.";
			throw std::runtime_error(_stream.str());
		}
	}
	
	for(const std::string& _message : messages)
	{
		mPriv->mFileHandle << _message;
	}
	
	if(mPriv->mHasAutoFlush)
	{
		FlushDevice();
	}
}